

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::ExpandLinkItems
          (cmGeneratorTarget *this,string *prop,string *value,string *config,
          cmGeneratorTarget *headTarget,bool usage_requirements_only,
          vector<cmLinkItem,_std::allocator<cmLinkItem>_> *items,bool *hadHeadSensitiveCondition)

{
  Snapshot snapshot;
  undefined8 this_00;
  char *pcVar1;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libs;
  cmGeneratorExpression ge;
  cmGeneratorExpressionDAGChecker dagChecker;
  allocator local_1c1;
  auto_ptr<cmCompiledGeneratorExpression> local_1c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  cmGeneratorTarget *local_1a0;
  undefined1 local_198 [32];
  long local_178;
  undefined1 local_170 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150 [4];
  Snapshot local_110;
  cmGeneratorExpressionDAGChecker local_f8;
  
  local_1a0 = headTarget;
  cmState::Snapshot::Snapshot(&local_110,(cmState *)0x0);
  local_198._0_8_ = local_198 + 0x10;
  local_198._8_8_ = 0;
  local_198[0x10] = '\0';
  local_178 = 0;
  snapshot.Position.Tree = local_110.Position.Tree;
  snapshot.State = local_110.State;
  snapshot.Position.Position = local_110.Position.Position;
  cmListFileBacktrace::cmListFileBacktrace
            ((cmListFileBacktrace *)&local_f8,snapshot,(cmCommandContext *)local_198);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_150,(cmListFileBacktrace *)&local_f8);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&local_f8);
  std::__cxx11::string::~string((string *)local_198);
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            (&local_f8,&this->Target->Name,prop,(GeneratorExpressionContent *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0);
  if (usage_requirements_only) {
    local_f8.TransitivePropertiesOnly = true;
  }
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_198,(string *)local_150);
  this_00 = local_198._0_8_;
  local_198._0_8_ = (pointer)0x0;
  local_1c0.x_ = (cmCompiledGeneratorExpression *)this_00;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_198);
  local_170._0_8_ = (long)local_170 + 0x10;
  local_170._8_8_ = (cmLinkedTree<cmState::SnapshotDataType> *)0x0;
  local_170[0x10] = '\0';
  pcVar1 = cmCompiledGeneratorExpression::Evaluate
                     ((cmCompiledGeneratorExpression *)this_00,this->LocalGenerator,config,false,
                      local_1a0,this,&local_f8,(string *)local_170);
  std::__cxx11::string::string((string *)local_198,pcVar1,&local_1c1);
  cmSystemTools::ExpandListArgument((string *)local_198,&local_1b8,false);
  std::__cxx11::string::~string((string *)local_198);
  std::__cxx11::string::~string((string *)local_170);
  LookupLinkItems(this,&local_1b8,items);
  *hadHeadSensitiveCondition = (local_1c0.x_)->HadHeadSensitiveCondition;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_1c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b8);
  cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&local_f8);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_150);
  return;
}

Assistant:

void cmGeneratorTarget::ExpandLinkItems(std::string const& prop,
                               std::string const& value,
                               std::string const& config,
                               cmGeneratorTarget const* headTarget,
                               bool usage_requirements_only,
                               std::vector<cmLinkItem>& items,
                               bool& hadHeadSensitiveCondition) const
{
  cmGeneratorExpression ge;
  cmGeneratorExpressionDAGChecker dagChecker(this->GetName(), prop, 0, 0);
  // The $<LINK_ONLY> expression may be in a link interface to specify private
  // link dependencies that are otherwise excluded from usage requirements.
  if(usage_requirements_only)
    {
    dagChecker.SetTransitivePropertiesOnly();
    }
  std::vector<std::string> libs;
  cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(value);
  cmSystemTools::ExpandListArgument(cge->Evaluate(
                                      this->LocalGenerator,
                                      config,
                                      false,
                                      headTarget,
                                      this, &dagChecker), libs);
  this->LookupLinkItems(libs, items);
  hadHeadSensitiveCondition = cge->GetHadHeadSensitiveCondition();
}